

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper_sse4.cpp
# Opt level: O0

void convertRGBA64FromRGBA64PM_sse4<false>(QRgba64 *buffer,QRgba64 *src,int count)

{
  undefined1 (*pauVar1) [16];
  long lVar2;
  undefined1 auVar3 [16];
  undefined8 uVar4;
  undefined1 auVar5 [12];
  undefined1 auVar6 [16];
  undefined1 auVar7 [12];
  undefined1 auVar8 [16];
  undefined1 auVar9 [12];
  undefined1 auVar10 [16];
  undefined1 auVar11 [12];
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  QRgba64 QVar29;
  undefined1 (*pauVar30) [16];
  undefined8 *puVar31;
  ulong *puVar32;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  float fVar34;
  undefined1 auVar33 [16];
  undefined8 extraout_XMM0_Qb;
  float fVar35;
  undefined1 auVar36 [16];
  __m128 afVar37;
  int _i;
  __m128i srcVector2AlphaMask;
  __m128i srcVector1AlphaMask;
  __m128 ia4;
  __m128 ia3;
  __m128 ia2;
  __m128 ia1;
  __m128i src4;
  __m128i src3;
  __m128i src2;
  __m128i src1;
  __m128 ia;
  __m128 a;
  __m128i srcVectorAlpha;
  __m128i srcVector2Alpha;
  __m128i srcVector1Alpha;
  bool opaque2;
  bool transparent2;
  bool opaque1;
  bool transparent1;
  __m128i srcVector2;
  __m128i srcVector1;
  __m128i zero;
  __m128i alphaMask;
  int i;
  QRgba64 v_1;
  QRgba64 v;
  undefined4 in_stack_fffffffffffff9b8;
  undefined4 in_stack_fffffffffffff9bc;
  int local_61c;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 local_588;
  undefined8 uStack_580;
  float local_578;
  float fStack_574;
  int local_4d0;
  float fStack_4a4;
  float fStack_4a0;
  float fStack_49c;
  float fStack_484;
  float fStack_480;
  float fStack_47c;
  float fStack_464;
  float fStack_460;
  float fStack_45c;
  float fStack_444;
  float fStack_440;
  float fStack_43c;
  uint uStack_2d4;
  uint uStack_2cc;
  uint uStack_2c4;
  uint uStack_2c0;
  uint uStack_2bc;
  uint uStack_2b4;
  uint uStack_2ac;
  uint uStack_2a4;
  uint uStack_2a0;
  uint uStack_29c;
  int local_298;
  int iStack_294;
  ushort uStack_26e;
  ushort uStack_26c;
  ushort uStack_26a;
  ushort uStack_24e;
  ushort uStack_24c;
  ushort uStack_24a;
  ushort local_238;
  ushort uStack_236;
  ushort uStack_234;
  ushort uStack_232;
  ushort local_218;
  ushort uStack_216;
  ushort uStack_214;
  ushort uStack_212;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  local_4d0 = 0;
  if ((MXCSR & 0x80) == 0) {
    for (; local_4d0 < in_EDX; local_4d0 = local_4d0 + 1) {
      QVar29 = QRgba64::unpremultiplied
                         ((QRgba64 *)CONCAT44(in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8));
      *(quint64 *)(in_RDI + (long)local_4d0 * 8) = QVar29.rgba;
    }
  }
  else {
    for (; local_4d0 < in_EDX + -3; local_4d0 = local_4d0 + 4) {
      pauVar1 = (undefined1 (*) [16])(in_RSI + (long)local_4d0 * 8);
      uVar12 = *(ulong *)*pauVar1;
      uVar13 = *(ulong *)(*pauVar1 + 8);
      auVar24 = *pauVar1;
      pauVar30 = (undefined1 (*) [16])(in_RSI + (long)(local_4d0 + 2) * 8);
      uVar14 = *(ulong *)*pauVar30;
      uVar15 = *(ulong *)(*pauVar30 + 8);
      auVar28 = *pauVar30;
      auVar36._8_8_ = 0xffff000000000000;
      auVar36._0_8_ = 0xffff000000000000;
      auVar17._8_8_ = 0xffff000000000000;
      auVar17._0_8_ = 0xffff000000000000;
      auVar33._8_8_ = 0xffff000000000000;
      auVar33._0_8_ = 0xffff000000000000;
      auVar16._8_8_ = 0xffff000000000000;
      auVar16._0_8_ = 0xffff000000000000;
      if (((auVar36 & *pauVar1) == (undefined1  [16])0x0) &&
         ((auVar33 & *pauVar30) == (undefined1  [16])0x0)) {
        puVar31 = (undefined8 *)(in_RDI + (long)local_4d0 * 8);
        *puVar31 = 0;
        puVar31[1] = 0;
        puVar31 = (undefined8 *)(in_RDI + (long)(local_4d0 + 2) * 8);
        *puVar31 = 0;
        puVar31[1] = 0;
      }
      else if (((auVar17 & ~*pauVar1) == (undefined1  [16])0x0) &&
              ((auVar16 & ~*pauVar30) == (undefined1  [16])0x0)) {
        if (in_RSI != in_RDI) {
          puVar32 = (ulong *)(in_RDI + (long)local_4d0 * 8);
          *puVar32 = uVar12;
          puVar32[1] = uVar13;
          puVar32 = (ulong *)(in_RDI + (long)(local_4d0 + 2) * 8);
          *puVar32 = uVar14;
          puVar32[1] = uVar15;
        }
      }
      else {
        auVar23._8_8_ = uVar13 >> 0x30;
        auVar23._0_8_ = uVar12 >> 0x30;
        auVar22._8_8_ = uVar15 >> 0x30;
        auVar22._0_8_ = uVar14 >> 0x30;
        auVar33 = packusdw(auVar23,auVar22);
        in_stack_fffffffffffff9b8 = 0xffffffff;
        in_stack_fffffffffffff9bc = 0xffffffff;
        local_298 = auVar33._0_4_;
        iStack_294 = auVar33._4_4_;
        afVar37[1] = (float)iStack_294;
        afVar37[0] = (float)local_298;
        afVar37[2] = 65535.0;
        afVar37[3] = 0.0;
        afVar37 = reciprocal_mul_ps(afVar37,6.72623e-44);
        fVar34 = (float)extraout_XMM0_Qb;
        fVar35 = (float)((ulong)extraout_XMM0_Qb >> 0x20);
        local_218 = (ushort)uVar12;
        uStack_216 = (ushort)(uVar12 >> 0x10);
        uStack_214 = (ushort)(uVar12 >> 0x20);
        uStack_212 = (ushort)(uVar12 >> 0x30);
        local_588._0_4_ = (uint)local_218;
        uStack_24e = (ushort)(uVar13 >> 0x10);
        uStack_24c = (ushort)(uVar13 >> 0x20);
        uStack_24a = (ushort)(uVar13 >> 0x30);
        uStack_590._0_4_ = (uint)uStack_24c;
        local_238 = (ushort)uVar14;
        uStack_236 = (ushort)(uVar14 >> 0x10);
        uStack_234 = (ushort)(uVar14 >> 0x20);
        uStack_232 = (ushort)(uVar14 >> 0x30);
        local_5a8._0_4_ = (uint)local_238;
        uStack_26e = (ushort)(uVar15 >> 0x10);
        uStack_26c = (ushort)(uVar15 >> 0x20);
        uStack_26a = (ushort)(uVar15 >> 0x30);
        uStack_5b0._0_4_ = (uint)uStack_26c;
        local_578 = afVar37[0];
        fStack_574 = afVar37[1];
        uStack_2a4 = (uint)uStack_216;
        uStack_2a0 = (uint)uStack_214;
        uStack_29c = (uint)uStack_212;
        uVar4 = CONCAT26((short)((uint)(float)uStack_2a4 >> 0x10),
                         CONCAT24(SUB42((float)uStack_2a4,0),(float)(uint)local_588));
        auVar5._8_2_ = SUB42((float)uStack_2a0,0);
        auVar5._0_8_ = uVar4;
        auVar5._10_2_ = (short)((uint)(float)uStack_2a0 >> 0x10);
        auVar3._12_2_ = SUB42((float)uStack_29c,0);
        auVar3._0_12_ = auVar5;
        auVar3._14_2_ = (short)((uint)(float)uStack_29c >> 0x10);
        fStack_444 = (float)((ulong)uVar4 >> 0x20);
        fStack_440 = auVar5._8_4_;
        fStack_43c = auVar3._12_4_;
        local_588 = CONCAT44((int)(fStack_444 * local_578),(int)((float)(uint)local_588 * local_578)
                            );
        uStack_580._0_4_ = (int)(fStack_440 * local_578);
        uStack_580._4_4_ = (int)(fStack_43c * local_578);
        uStack_2b4 = (uint)uStack_24e;
        uStack_2ac = (uint)uStack_24a;
        uVar4 = CONCAT26((short)((uint)(float)uStack_2b4 >> 0x10),
                         CONCAT24(SUB42((float)uStack_2b4,0),(float)(ushort)uVar13));
        auVar7._8_2_ = SUB42((float)(uint)uStack_590,0);
        auVar7._0_8_ = uVar4;
        auVar7._10_2_ = (short)((uint)(float)(uint)uStack_590 >> 0x10);
        auVar6._12_2_ = SUB42((float)uStack_2ac,0);
        auVar6._0_12_ = auVar7;
        auVar6._14_2_ = (short)((uint)(float)uStack_2ac >> 0x10);
        fStack_464 = (float)((ulong)uVar4 >> 0x20);
        fStack_460 = auVar7._8_4_;
        fStack_45c = auVar6._12_4_;
        local_598 = CONCAT44((int)(fStack_464 * fStack_574),
                             (int)((float)(ushort)uVar13 * fStack_574));
        uStack_590 = CONCAT44((int)(fStack_45c * fStack_574),(int)(fStack_460 * fStack_574));
        uStack_2c4 = (uint)uStack_236;
        uStack_2c0 = (uint)uStack_234;
        uStack_2bc = (uint)uStack_232;
        uVar4 = CONCAT26((short)((uint)(float)uStack_2c4 >> 0x10),
                         CONCAT24(SUB42((float)uStack_2c4,0),(float)(uint)local_5a8));
        auVar9._8_2_ = SUB42((float)uStack_2c0,0);
        auVar9._0_8_ = uVar4;
        auVar9._10_2_ = (short)((uint)(float)uStack_2c0 >> 0x10);
        auVar8._12_2_ = SUB42((float)uStack_2bc,0);
        auVar8._0_12_ = auVar9;
        auVar8._14_2_ = (short)((uint)(float)uStack_2bc >> 0x10);
        fStack_484 = (float)((ulong)uVar4 >> 0x20);
        fStack_480 = auVar9._8_4_;
        fStack_47c = auVar8._12_4_;
        local_5a8 = CONCAT44((int)(fStack_484 * fVar34),(int)((float)(uint)local_5a8 * fVar34));
        uStack_5a0._0_4_ = (int)(fStack_480 * fVar34);
        uStack_5a0._4_4_ = (int)(fStack_47c * fVar34);
        uStack_2d4 = (uint)uStack_26e;
        uStack_2cc = (uint)uStack_26a;
        uVar4 = CONCAT26((short)((uint)(float)uStack_2d4 >> 0x10),
                         CONCAT24(SUB42((float)uStack_2d4,0),(float)(ushort)uVar15));
        auVar11._8_2_ = SUB42((float)(uint)uStack_5b0,0);
        auVar11._0_8_ = uVar4;
        auVar11._10_2_ = (short)((uint)(float)(uint)uStack_5b0 >> 0x10);
        auVar10._12_2_ = SUB42((float)uStack_2cc,0);
        auVar10._0_12_ = auVar11;
        auVar10._14_2_ = (short)((uint)(float)uStack_2cc >> 0x10);
        fStack_4a4 = (float)((ulong)uVar4 >> 0x20);
        fStack_4a0 = auVar11._8_4_;
        fStack_49c = auVar10._12_4_;
        local_5b8 = CONCAT44((int)(fStack_4a4 * fVar35),(int)((float)(ushort)uVar15 * fVar35));
        uStack_5b0 = CONCAT44((int)(fStack_49c * fVar35),(int)(fStack_4a0 * fVar35));
        auVar21._8_8_ = uStack_580;
        auVar21._0_8_ = local_588;
        auVar20._8_8_ = uStack_590;
        auVar20._0_8_ = local_598;
        auVar33 = packusdw(auVar21,auVar20);
        auVar19._8_8_ = uStack_5a0;
        auVar19._0_8_ = local_5a8;
        auVar18._8_8_ = uStack_5b0;
        auVar18._0_8_ = local_5b8;
        auVar36 = packusdw(auVar19,auVar18);
        local_588 = auVar33._0_8_;
        uStack_580 = auVar33._8_8_;
        local_5a8 = auVar36._0_8_;
        uStack_5a0 = auVar36._8_8_;
        auVar27._8_8_ = ~-(ulong)(uVar13 >> 0x30 == 0) & uStack_580;
        auVar27._0_8_ = ~-(ulong)(uVar12 >> 0x30 == 0) & local_588;
        auVar26._8_8_ = 0xffff000000000000;
        auVar26._0_8_ = 0xffff000000000000;
        auVar33 = pblendvb(auVar27,auVar24,auVar26);
        auVar25._8_8_ = (-(ulong)(uVar15 >> 0x30 == 0) ^ 0xffffffffffffffff) & uStack_5a0;
        auVar25._0_8_ =
             (-(ulong)(uVar14 >> 0x30 == 0) ^
             CONCAT44(in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8)) & local_5a8;
        auVar24._8_8_ = 0xffff000000000000;
        auVar24._0_8_ = 0xffff000000000000;
        auVar36 = pblendvb(auVar25,auVar28,auVar24);
        puVar31 = (undefined8 *)(in_RDI + (long)local_4d0 * 8);
        local_588 = auVar33._0_8_;
        uStack_580 = auVar33._8_8_;
        *puVar31 = local_588;
        puVar31[1] = uStack_580;
        puVar31 = (undefined8 *)(in_RDI + (long)(local_4d0 + 2) * 8);
        local_5a8 = auVar36._0_8_;
        uStack_5a0 = auVar36._8_8_;
        *puVar31 = local_5a8;
        puVar31[1] = uStack_5a0;
      }
    }
    for (local_61c = 0; local_61c < 3 && local_4d0 < in_EDX; local_61c = local_61c + 1) {
      QVar29 = QRgba64::unpremultiplied
                         ((QRgba64 *)CONCAT44(in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8));
      *(quint64 *)(in_RDI + (long)local_4d0 * 8) = QVar29.rgba;
      local_4d0 = local_4d0 + 1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static inline void convertRGBA64FromRGBA64PM_sse4(QRgba64 *buffer, const QRgba64 *src, int count)
{
    int i = 0;
    if ((_MM_GET_EXCEPTION_MASK() & _MM_MASK_INVALID) == 0) {
        for (; i < count; ++i) {
            QRgba64 v = src[i].unpremultiplied();
            if (mask)
                v.setAlpha(65535);
            buffer[i] = v;
        }
        return;
    }
    const __m128i alphaMask = _mm_set1_epi64x(qint64(Q_UINT64_C(0xffff) << 48));
    const __m128i zero = _mm_setzero_si128();

    for (; i < count - 3; i += 4) {
        __m128i srcVector1 = _mm_loadu_si128((const __m128i *)&src[i + 0]);
        __m128i srcVector2 = _mm_loadu_si128((const __m128i *)&src[i + 2]);
        bool transparent1 = _mm_testz_si128(srcVector1, alphaMask);
        bool opaque1 = _mm_testc_si128(srcVector1, alphaMask);
        bool transparent2 = _mm_testz_si128(srcVector2, alphaMask);
        bool opaque2 = _mm_testc_si128(srcVector2, alphaMask);

        if (!(transparent1 && transparent2)) {
            if (!(opaque1 && opaque2)) {
                __m128i srcVector1Alpha = _mm_srli_epi64(srcVector1, 48);
                __m128i srcVector2Alpha = _mm_srli_epi64(srcVector2, 48);
                __m128i srcVectorAlpha = _mm_packus_epi32(srcVector1Alpha, srcVector2Alpha);
                const __m128 a = _mm_cvtepi32_ps(srcVectorAlpha);
                const __m128 ia = reciprocal_mul_ps(a, 65535.0f);
                __m128i src1 = _mm_unpacklo_epi16(srcVector1, zero);
                __m128i src2 = _mm_unpackhi_epi16(srcVector1, zero);
                __m128i src3 = _mm_unpacklo_epi16(srcVector2, zero);
                __m128i src4 = _mm_unpackhi_epi16(srcVector2, zero);
                __m128 ia1 = _mm_shuffle_ps(ia, ia, _MM_SHUFFLE(0, 0, 0, 0));
                __m128 ia2 = _mm_shuffle_ps(ia, ia, _MM_SHUFFLE(1, 1, 1, 1));
                __m128 ia3 = _mm_shuffle_ps(ia, ia, _MM_SHUFFLE(2, 2, 2, 2));
                __m128 ia4 = _mm_shuffle_ps(ia, ia, _MM_SHUFFLE(3, 3, 3, 3));
                src1 = _mm_cvtps_epi32(_mm_mul_ps(_mm_cvtepi32_ps(src1), ia1));
                src2 = _mm_cvtps_epi32(_mm_mul_ps(_mm_cvtepi32_ps(src2), ia2));
                src3 = _mm_cvtps_epi32(_mm_mul_ps(_mm_cvtepi32_ps(src3), ia3));
                src4 = _mm_cvtps_epi32(_mm_mul_ps(_mm_cvtepi32_ps(src4), ia4));
                src1 = _mm_packus_epi32(src1, src2);
                src3 = _mm_packus_epi32(src3, src4);
                // Handle potential alpha == 0 values:
                __m128i srcVector1AlphaMask = _mm_cmpeq_epi64(srcVector1Alpha, zero);
                __m128i srcVector2AlphaMask = _mm_cmpeq_epi64(srcVector2Alpha, zero);
                src1 = _mm_andnot_si128(srcVector1AlphaMask, src1);
                src3 = _mm_andnot_si128(srcVector2AlphaMask, src3);
                // Fixup alpha values:
                if (mask) {
                    src1 = _mm_or_si128(src1, alphaMask);
                    src3 = _mm_or_si128(src3, alphaMask);
                } else {
                    src1 = _mm_blendv_epi8(src1, srcVector1, alphaMask);
                    src3 = _mm_blendv_epi8(src3, srcVector2, alphaMask);
                }
                _mm_storeu_si128((__m128i *)&buffer[i + 0], src1);
                _mm_storeu_si128((__m128i *)&buffer[i + 2], src3);
            } else {
                if (mask) {
                    srcVector1 = _mm_or_si128(srcVector1, alphaMask);
                    srcVector2 = _mm_or_si128(srcVector2, alphaMask);
                }
                if (mask || src != buffer) {
                    _mm_storeu_si128((__m128i *)&buffer[i + 0], srcVector1);
                    _mm_storeu_si128((__m128i *)&buffer[i + 2], srcVector2);
                }
            }
        } else {
            _mm_storeu_si128((__m128i *)&buffer[i + 0], zero);
            _mm_storeu_si128((__m128i *)&buffer[i + 2], zero);
        }
    }

    SIMD_EPILOGUE(i, count, 3) {
        QRgba64 v = src[i].unpremultiplied();
        if (mask)
            v.setAlpha(65535);
        buffer[i] = v;
    }
}